

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_QPDFTokenizer.cc
# Opt level: O0

void __thiscall Pl_QPDFTokenizer::finish(Pl_QPDFTokenizer *this)

{
  TokenFilter *pTVar1;
  char __c;
  bool bVar2;
  token_type_e tVar3;
  pointer pMVar4;
  Buffer *buf;
  Pipeline *pPVar5;
  string *context;
  allocator<char> local_271;
  string local_270;
  Token local_250;
  char local_1e2;
  allocator<char> local_1e1;
  undefined1 local_1e0 [6];
  char ch;
  int local_1bc;
  undefined1 local_1b8 [8];
  Token token;
  string empty;
  allocator<char> local_119;
  string local_118;
  undefined1 local_f8 [8];
  BufferInputSource input;
  Pl_QPDFTokenizer *this_local;
  
  input.max_offset = (qpdf_offset_t)this;
  pMVar4 = std::
           unique_ptr<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>::
           operator->(&this->m);
  Pl_Buffer::finish(&pMVar4->buf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"tokenizer data",&local_119);
  pMVar4 = std::
           unique_ptr<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>::
           operator->(&this->m);
  buf = Pl_Buffer::getBuffer(&pMVar4->buf);
  BufferInputSource::BufferInputSource((BufferInputSource *)local_f8,&local_118,buf,true);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  std::__cxx11::string::string((string *)(token.error_message.field_2._M_local_buf + 8));
  do {
    pMVar4 = std::
             unique_ptr<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>
             ::operator->(&this->m);
    context = (string *)((long)&token.error_message.field_2 + 8);
    QPDFTokenizer::readToken
              ((Token *)local_1b8,&pMVar4->tokenizer,(InputSource *)local_f8,context,true,0);
    pMVar4 = std::
             unique_ptr<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>
             ::operator->(&this->m);
    (*pMVar4->filter->_vptr_TokenFilter[2])(pMVar4->filter,local_1b8);
    tVar3 = QPDFTokenizer::Token::getType((Token *)local_1b8);
    if (tVar3 == tt_eof) {
      local_1bc = 3;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_1e0,"ID",&local_1e1);
      bVar2 = QPDFTokenizer::Token::isWord((Token *)local_1b8,(string *)local_1e0);
      std::__cxx11::string::~string((string *)local_1e0);
      std::allocator<char>::~allocator(&local_1e1);
      if (bVar2) {
        local_1e2 = ' ';
        BufferInputSource::read
                  ((BufferInputSource *)local_f8,(int)&local_1e2,(void *)0x1,(size_t)context);
        pMVar4 = std::
                 unique_ptr<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                 ::operator->(&this->m);
        __c = local_1e2;
        pTVar1 = pMVar4->filter;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,1,__c,&local_271);
        QPDFTokenizer::Token::Token(&local_250,tt_space,&local_270);
        (*pTVar1->_vptr_TokenFilter[2])(pTVar1,&local_250);
        QPDFTokenizer::Token::~Token(&local_250);
        std::__cxx11::string::~string((string *)&local_270);
        std::allocator<char>::~allocator(&local_271);
        QTC::TC("qpdf","Pl_QPDFTokenizer found ID",0);
        pMVar4 = std::
                 unique_ptr<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                 ::operator->(&this->m);
        QPDFTokenizer::expectInlineImage(&pMVar4->tokenizer,(InputSource *)local_f8);
      }
      local_1bc = 0;
    }
    QPDFTokenizer::Token::~Token((Token *)local_1b8);
  } while (local_1bc == 0);
  pMVar4 = std::
           unique_ptr<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>::
           operator->(&this->m);
  (*pMVar4->filter->_vptr_TokenFilter[3])();
  pMVar4 = std::
           unique_ptr<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>::
           operator->(&this->m);
  QPDFObjectHandle::TokenFilter::PipelineAccessor::setPipeline(pMVar4->filter,(Pipeline *)0x0);
  pPVar5 = Pipeline::next(&this->super_Pipeline);
  if (pPVar5 != (Pipeline *)0x0) {
    pPVar5 = Pipeline::next(&this->super_Pipeline);
    (*pPVar5->_vptr_Pipeline[3])();
  }
  std::__cxx11::string::~string((string *)(token.error_message.field_2._M_local_buf + 8));
  BufferInputSource::~BufferInputSource((BufferInputSource *)local_f8);
  return;
}

Assistant:

void
Pl_QPDFTokenizer::finish()
{
    m->buf.finish();
    auto input = BufferInputSource("tokenizer data", m->buf.getBuffer(), true);
    std::string empty;
    while (true) {
        auto token = m->tokenizer.readToken(input, empty, true);
        m->filter->handleToken(token);
        if (token.getType() == QPDFTokenizer::tt_eof) {
            break;
        } else if (token.isWord("ID")) {
            // Read the space after the ID.
            char ch = ' ';
            input.read(&ch, 1);
            m->filter->handleToken(
                // line-break
                QPDFTokenizer::Token(QPDFTokenizer::tt_space, std::string(1, ch)));
            QTC::TC("qpdf", "Pl_QPDFTokenizer found ID");
            m->tokenizer.expectInlineImage(input);
        }
    }
    m->filter->handleEOF();
    QPDFObjectHandle::TokenFilter::PipelineAccessor::setPipeline(m->filter, nullptr);
    if (next()) {
        next()->finish();
    }
}